

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O2

int diffs(double *sig,int N,int D,int s,double *oup)

{
  double *C;
  long lVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  long lVar6;
  double dVar7;
  
  lVar3 = (long)(s * D);
  C = (double *)malloc(lVar3 * 8 + 8);
  delds(D,s,C);
  lVar1 = (long)s;
  pdVar2 = sig + (lVar3 - lVar1);
  for (lVar4 = lVar3; lVar4 < N; lVar4 = lVar4 + 1) {
    dVar7 = 0.0;
    pdVar5 = pdVar2;
    for (lVar6 = lVar1; lVar6 <= lVar3; lVar6 = lVar6 + lVar1) {
      dVar7 = dVar7 + *pdVar5 * C[lVar6];
      pdVar5 = pdVar5 + -lVar1;
    }
    oup[lVar4 - lVar3] = *C * sig[lVar4] + dVar7;
    pdVar2 = pdVar2 + 1;
  }
  free(C);
  return N - s * D;
}

Assistant:

int diffs(double *sig, int N, int D,int s, double *oup) {
	int Noup,i,j,d;
	double *coeff;
	double sum;
	/*
	 * diffs output = [ X(t) - X(t-s) ] ^ D where X(t) is the
	 * input timeseries of length N
	 * output is of length N - D*s
	 * 
	 * 
	 * s - seasonal component, D = 1 when seasonal component is present and 0
	 * when it is absent. D >= 2 is rarely needed and in most cases you may want
	 *  to re-analyze data if D >= 2 is needed.
	 * s = 4 (quarterly data), 12 (yearly data) etc.
	 * 
	 * D - Differencing operator. D >= 1 when seasonal component is present
	 * D is usually 1 when you are differencing [ X(t) - X(t-s) ]
	 * D = 2 yields [ X(t) - X(t-s) ] * [ X(t) - X(t-s) ]
	 * see Chapter 9 of Box Jenkins for detrending and deseasoning seasonal data
	 * with trends 
	 */ 
	
	d = D*s;
	coeff = (double*) malloc(sizeof(double) * (d+1));
	delds(D,s,coeff);
	Noup = N - d;
	
	for(i = d; i < N;++i) {
		sum = 0.;
		for(j = s; j < d+1;j+=s) {
			sum += sig[i-j]*coeff[j];
		}
		oup[i-d] = sum + coeff[0] * sig[i];
		
	}
	
	free(coeff);
	
	return Noup;
}